

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void ex_al_eu(BigNum *r1,BigNum *r2,BigNum *gcd,BigNum *a,BigNum *b)

{
  BigNum *gcd_00;
  bool bVar1;
  BigNum *local_250;
  BigNum *local_238;
  BigNum *local_228;
  BigNum *local_218;
  BigNum local_200;
  BigNum local_1e0;
  BigNum local_1c0;
  BigNum local_1a0;
  BigNum local_180;
  BigNum local_160;
  BigNum local_140;
  BigNum local_120;
  BigNum local_100;
  BigNum local_e0;
  BigNum local_c0;
  BigNum local_90;
  BigNum local_70;
  BigNum local_50;
  BigNum *local_30;
  BigNum *b_local;
  BigNum *a_local;
  BigNum *gcd_local;
  BigNum *r2_local;
  BigNum *r1_local;
  
  local_30 = b;
  b_local = a;
  a_local = gcd;
  gcd_local = r2;
  r2_local = r1;
  BigNum::BigNum(&local_70,r1);
  BigNum::BigNum(&local_90,r2);
  bVar1 = operator>(&local_70,&local_90);
  local_218 = r1;
  if (!bVar1) {
    local_218 = r2;
  }
  BigNum::BigNum(&local_50,local_218);
  BigNum::BigNum(&local_e0,r1);
  BigNum::BigNum(&local_100,r2);
  bVar1 = operator<(&local_e0,&local_100);
  local_228 = r1;
  if (!bVar1) {
    local_228 = r2;
  }
  BigNum::BigNum(&local_c0,local_228);
  BigNum::BigNum(&local_120,1);
  BigNum::BigNum(&local_140,0);
  BigNum::BigNum(&local_160,0);
  BigNum::BigNum(&local_180,1);
  gcd_00 = a_local;
  BigNum::BigNum(&local_1a0,r1);
  BigNum::BigNum(&local_1c0,r2);
  bVar1 = operator>(&local_1a0,&local_1c0);
  if (bVar1) {
    local_238 = b_local;
  }
  else {
    local_238 = local_30;
  }
  BigNum::BigNum(&local_1e0,r1);
  BigNum::BigNum(&local_200,r2);
  bVar1 = operator<(&local_1e0,&local_200);
  if (bVar1) {
    local_250 = b_local;
  }
  else {
    local_250 = local_30;
  }
  ex_al_eu_in(&local_50,&local_c0,&local_120,&local_140,&local_160,&local_180,gcd_00,local_238,
              local_250);
  BigNum::~BigNum(&local_200);
  BigNum::~BigNum(&local_1e0);
  BigNum::~BigNum(&local_1c0);
  BigNum::~BigNum(&local_1a0);
  BigNum::~BigNum(&local_180);
  BigNum::~BigNum(&local_160);
  BigNum::~BigNum(&local_140);
  BigNum::~BigNum(&local_120);
  BigNum::~BigNum(&local_c0);
  BigNum::~BigNum(&local_100);
  BigNum::~BigNum(&local_e0);
  BigNum::~BigNum(&local_50);
  BigNum::~BigNum(&local_90);
  BigNum::~BigNum(&local_70);
  return;
}

Assistant:

void ex_al_eu(BigNum r1, BigNum r2, BigNum &gcd, BigNum &a, BigNum &b) {
    ex_al_eu_in(r1 > r2 ? r1 : r2, r1 < r2 ? r1 : r2, BigNum(1), BigNum(0), BigNum(0), BigNum(1), gcd, r1 > r2 ? a : b, r1 < r2 ? a : b);
}